

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Section::~Section(Section *this)

{
  pointer pcVar1;
  char cVar2;
  IResultCapture *pIVar3;
  long lVar4;
  undefined1 local_a0 [8];
  SectionEndInfo endInfo;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_0017fa78;
  if (this->m_sectionIncluded == true) {
    gettimeofday((timeval *)local_a0,(__timezone_ptr_t)0x0);
    SectionEndInfo::SectionEndInfo
              ((SectionEndInfo *)local_a0,&this->m_info,&this->m_assertions,
               (double)(uint)((local_a0._0_4_ * 1000000 +
                              (int)endInfo.sectionInfo.name._M_dataplus._M_p) -
                             (int)(this->m_timer).m_ticks) / 1000000.0);
    cVar2 = std::uncaught_exception();
    if (cVar2 == '\0') {
      pIVar3 = getResultCapture();
      lVar4 = 0x20;
    }
    else {
      pIVar3 = getResultCapture();
      lVar4 = 0x28;
    }
    (**(code **)((long)pIVar3->_vptr_IResultCapture + lVar4))(pIVar3,local_a0);
    if ((size_type *)endInfo.sectionInfo.description.field_2._8_8_ !=
        &endInfo.sectionInfo.lineInfo.file._M_string_length) {
      operator_delete((void *)endInfo.sectionInfo.description.field_2._8_8_);
    }
    if ((size_type *)endInfo.sectionInfo.name.field_2._8_8_ !=
        &endInfo.sectionInfo.description._M_string_length) {
      operator_delete((void *)endInfo.sectionInfo.name.field_2._8_8_);
    }
    if ((size_type *)CONCAT44(local_a0._4_4_,local_a0._0_4_) !=
        &endInfo.sectionInfo.name._M_string_length) {
      operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_));
    }
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).lineInfo.file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).lineInfo.file.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).description._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).description.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_info).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).name.field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

Section::~Section() {
		if (m_sectionIncluded) {
			SectionEndInfo endInfo(m_info, m_assertions, m_timer.getElapsedSeconds());
			if (std::uncaught_exception())
				getResultCapture().sectionEndedEarly(endInfo);
			else
				getResultCapture().sectionEnded(endInfo);
		}
	}